

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_various_ostream_ops(void)

{
  __type _Var1;
  bool bVar2;
  _Setw _Var3;
  unsigned_long uVar4;
  void *pvVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  char *pcVar10;
  int in_R8D;
  byte local_1ba2;
  byte local_1b92;
  byte local_1b72;
  byte local_1b52;
  byte local_1b3a;
  byte local_1b22;
  byte local_1b0a;
  byte local_1afa;
  byte local_1aea;
  byte local_1ada;
  byte local_1ac9;
  byte local_1a21;
  byte local_1979;
  uintwide_t<256U,_unsigned_short,_void,_false> local_18ea;
  undefined1 local_18c9;
  undefined1 local_18c8 [7];
  bool result_read_and_round_trip_neg_hex_str_is_ok;
  undefined1 local_18a8 [8];
  local_uintwide_t_small_unsigned_type m1_from_strm;
  stringstream strm_12;
  undefined1 local_1878 [382];
  undefined1 local_16fa [8];
  local_uintwide_t_small_unsigned_type m1;
  bool result_n_is_ok_2;
  undefined1 local_16b8 [8];
  local_uintwide_t_small_signed_type n_strm_2;
  stringstream strm_11;
  undefined1 local_1688 [376];
  undefined1 local_1510 [8];
  uintwide_t<256U,_unsigned_short,_void,_true> n_2;
  uint i_5;
  bool result_n_is_ok_1;
  undefined1 local_14c8 [8];
  local_uintwide_t_small_signed_type n_strm_1;
  stringstream strm_10;
  undefined1 local_1498 [376];
  undefined1 local_1320 [8];
  uintwide_t<256U,_unsigned_short,_void,_true> n_1;
  uint i_4;
  bool result_n_is_ok;
  undefined1 local_12d8 [8];
  local_uintwide_t_small_signed_type n_strm;
  stringstream strm_9;
  undefined1 local_12a8 [376];
  undefined1 local_1130 [8];
  uintwide_t<256U,_unsigned_short,_void,_true> n;
  uint i_3;
  bool result_u_is_ok_2;
  undefined1 local_10e8 [8];
  local_uintwide_t_small_unsigned_type u_strm_2;
  stringstream strm_8;
  undefined1 local_10b8 [376];
  undefined1 local_f40 [8];
  uintwide_t<256U,_unsigned_short,_void,_false> u_5;
  uint i_2;
  bool result_u_is_ok_1;
  undefined1 local_ef8 [8];
  local_uintwide_t_small_unsigned_type u_strm_1;
  stringstream strm_7;
  undefined1 local_ec8 [376];
  undefined1 local_d50 [8];
  uintwide_t<256U,_unsigned_short,_void,_false> u_4;
  uint i_1;
  bool result_u_is_ok;
  undefined1 local_d08 [8];
  local_uintwide_t_small_unsigned_type u_strm;
  stringstream strm_6;
  undefined1 local_cd8 [380];
  undefined1 local_b5c [8];
  uintwide_t<256U,_unsigned_short,_void,_false> u_3;
  uint i;
  stringstream local_b10 [7];
  bool result_zero_print_as_hex_is_ok;
  stringstream strm_5;
  undefined1 local_b00 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_988;
  undefined1 local_961;
  stringstream local_960 [7];
  bool result_zero_print_as_dec_is_ok;
  stringstream strm_4;
  undefined1 local_950 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7d8;
  undefined1 local_7b1;
  stringstream local_7b0 [7];
  bool result_zero_print_as_oct_is_ok;
  stringstream strm_3;
  undefined1 local_7a0 [376];
  undefined1 local_628 [8];
  local_uintwide_t_small_unsigned_type z;
  allocator<char> local_5e1;
  undefined1 local_5e0 [6];
  __type result_u_fill_is_ok_2;
  string str_ctrl_2;
  stringstream local_5b8 [8];
  stringstream strm_2;
  undefined1 local_5a8 [376];
  undefined1 local_430 [8];
  local_uintwide_t_small_unsigned_type u_2;
  allocator<char> local_3e9;
  undefined1 local_3e8 [6];
  __type result_u_fill_is_ok_1;
  string str_ctrl_1;
  stringstream local_3c0 [8];
  stringstream strm_1;
  undefined1 local_3b0 [376];
  undefined1 local_238 [8];
  local_uintwide_t_small_unsigned_type u_1;
  allocator<char> local_1f1;
  undefined1 local_1f0 [6];
  __type result_u_fill_is_ok;
  string str_ctrl;
  stringstream local_1b8 [8];
  stringstream strm;
  undefined1 local_1a8 [382];
  undefined1 local_2a [8];
  local_uintwide_t_small_unsigned_type u;
  bool result_is_ok;
  
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = 1;
  uVar4 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_24UL,_10UL,_24UL>,_223UL,_23UL>
          *)eng_sgn,uVar4);
  uVar4 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::
  discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
  ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
          *)eng_dig,uVar4);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (local_2a,0x72b3,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream(local_1b8);
  pvVar5 = (void *)std::ostream::operator<<(local_1a8,std::dec);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar5,std::showbase);
  _Var3 = std::setw(100);
  poVar6 = std::operator<<(poVar6,_Var3);
  str_ctrl.field_2._M_local_buf[0xf] = (char)std::setfill<char>('#');
  poVar6 = std::operator<<(poVar6,str_ctrl.field_2._M_local_buf[0xf]);
  math::wide_integer::operator<<(poVar6,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1f0,100,'#',&local_1f1);
  std::allocator<char>::~allocator(&local_1f1);
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0
                      ,sVar7 - 5);
  *pvVar8 = '2';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0
                      ,sVar7 - 4);
  *pvVar8 = '9';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0
                      ,sVar7 - 3);
  *pvVar8 = '3';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0
                      ,sVar7 - 2);
  *pvVar8 = '6';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0
                      ,sVar7 - 1);
  *pvVar8 = '3';
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (u_1.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1f0);
  std::__cxx11::string::~string
            ((string *)(u_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  local_1979 = 0;
  if (_Var1) {
    local_1979 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1979 & 1;
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (local_238,0xa2f7,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream(local_3c0);
  pvVar5 = (void *)std::ostream::operator<<(local_3b0,std::hex);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::uppercase);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar5,std::showbase);
  str_ctrl_1.field_2._12_4_ = std::setw(100);
  poVar6 = std::operator<<(poVar6,(_Setw)str_ctrl_1.field_2._12_4_);
  str_ctrl_1.field_2._M_local_buf[0xb] = (char)std::setfill<char>('#');
  poVar6 = std::operator<<(poVar6,str_ctrl_1.field_2._M_local_buf[0xb]);
  math::wide_integer::operator<<(poVar6,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_3e8,100,'#',&local_3e9);
  std::allocator<char>::~allocator(&local_3e9);
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                      ,sVar7 - 6);
  *pvVar8 = '0';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                      ,sVar7 - 5);
  *pvVar8 = 'X';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                      ,sVar7 - 4);
  *pvVar8 = 'A';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                      ,sVar7 - 3);
  *pvVar8 = '2';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                      ,sVar7 - 2);
  *pvVar8 = 'F';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e8
                      ,sVar7 - 1);
  *pvVar8 = '7';
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (u_2.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3e8);
  std::__cxx11::string::~string
            ((string *)(u_2.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  local_1a21 = 0;
  if (_Var1) {
    local_1a21 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1a21 & 1;
  std::__cxx11::string::~string((string *)local_3e8);
  std::__cxx11::stringstream::~stringstream(local_3c0);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (local_430,0x72b3,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream(local_5b8);
  pvVar5 = (void *)std::ostream::operator<<(local_5a8,std::oct);
  pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::uppercase);
  poVar6 = (ostream *)std::ostream::operator<<(pvVar5,std::showbase);
  str_ctrl_2.field_2._12_4_ = std::setw(100);
  poVar6 = std::operator<<(poVar6,(_Setw)str_ctrl_2.field_2._12_4_);
  str_ctrl_2.field_2._M_local_buf[0xb] = (char)std::setfill<char>('#');
  poVar6 = std::operator<<(poVar6,str_ctrl_2.field_2._M_local_buf[0xb]);
  math::wide_integer::operator<<(poVar6,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_5e0,100,'#',&local_5e1);
  std::allocator<char>::~allocator(&local_5e1);
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0
                      ,sVar7 - 6);
  *pvVar8 = '0';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0
                      ,sVar7 - 5);
  *pvVar8 = '7';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0
                      ,sVar7 - 4);
  *pvVar8 = '1';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0
                      ,sVar7 - 3);
  *pvVar8 = '2';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0
                      ,sVar7 - 2);
  *pvVar8 = '6';
  sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0)
  ;
  pvVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::at
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0
                      ,sVar7 - 1);
  *pvVar8 = '3';
  std::__cxx11::stringstream::str();
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (z.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_5e0);
  std::__cxx11::string::~string((string *)(z.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  local_1ac9 = 0;
  if (_Var1) {
    local_1ac9 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1ac9 & 1;
  std::__cxx11::string::~string((string *)local_5e0);
  std::__cxx11::stringstream::~stringstream(local_5b8);
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (local_628,0,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  std::__cxx11::stringstream::stringstream(local_7b0);
  pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_7a0,std::oct);
  math::wide_integer::operator<<(pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_628);
  std::__cxx11::stringstream::str();
  bVar2 = std::operator==(&local_7d8,"0");
  std::__cxx11::string::~string((string *)&local_7d8);
  local_1ada = 0;
  if (bVar2) {
    local_1ada = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1ada & 1;
  local_7b1 = bVar2;
  std::__cxx11::stringstream::~stringstream(local_7b0);
  std::__cxx11::stringstream::stringstream(local_960);
  pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_950,std::dec);
  math::wide_integer::operator<<(pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_628);
  std::__cxx11::stringstream::str();
  bVar2 = std::operator==(&local_988,"0");
  std::__cxx11::string::~string((string *)&local_988);
  local_1aea = 0;
  if (bVar2) {
    local_1aea = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1aea & 1;
  local_961 = bVar2;
  std::__cxx11::stringstream::~stringstream(local_960);
  std::__cxx11::stringstream::stringstream(local_b10);
  pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_b00,std::hex);
  math::wide_integer::operator<<(pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_628);
  std::__cxx11::stringstream::str();
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (u_3.values.super_array<unsigned_short,_16UL>.elems + 0xe),"0");
  std::__cxx11::string::~string
            ((string *)(u_3.values.super_array<unsigned_short,_16UL>.elems + 0xe));
  local_1afa = 0;
  if (bVar2) {
    local_1afa = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1afa & 1;
  std::__cxx11::stringstream::~stringstream(local_b10);
  u_3.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_3.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)u_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x400;
      u_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_b5c,
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(u_strm.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(local_cd8,std::dec);
    math::wide_integer::operator<<
              (pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_b5c);
    std::__cxx11::stringstream::str();
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_d08,pcVar10);
    std::__cxx11::string::~string((string *)&i_1);
    u_4.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_b5c,
                    (uintwide_t<256U,_unsigned_short,_void,_false> *)local_d08);
    local_1b0a = 0;
    if ((bool)u_4.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_) {
      local_1b0a = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
    }
    u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1b0a & 1;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(u_strm.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  }
  u_4.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_4.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)u_4.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x400;
      u_4.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_4.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_d50,
               (test_uintwide_t_edge *)0x1,true,0x40,in_R8D);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(u_strm_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    pvVar5 = (void *)std::ostream::operator<<(local_ec8,std::hex);
    pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(pvVar5,std::showbase);
    math::wide_integer::operator<<
              (pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_d50);
    std::__cxx11::stringstream::str();
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_2);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_ef8,pcVar10);
    std::__cxx11::string::~string((string *)&i_2);
    u_5.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_d50,
                    (uintwide_t<256U,_unsigned_short,_void,_false> *)local_ef8);
    local_1b22 = 0;
    if ((bool)u_5.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_) {
      local_1b22 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
    }
    u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1b22 & 1;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(u_strm_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  }
  u_5.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_5.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)u_5.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x400;
      u_5.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_5.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_f40,
               (test_uintwide_t_edge *)0x1,true,0x55,in_R8D);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(u_strm_2.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    pvVar5 = (void *)std::ostream::operator<<(local_10b8,std::oct);
    pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(pvVar5,std::showbase);
    math::wide_integer::operator<<
              (pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_f40);
    std::__cxx11::stringstream::str();
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_3);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_10e8,pcVar10);
    std::__cxx11::string::~string((string *)&i_3);
    n.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_f40,
                    (uintwide_t<256U,_unsigned_short,_void,_false> *)local_10e8);
    local_1b3a = 0;
    if ((bool)n.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_) {
      local_1b3a = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
    }
    u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1b3a & 1;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(u_strm_2.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  }
  n.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  n.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)n.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x400;
      n.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           n.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_1130,
               (test_uintwide_t_edge *)0x0,false,0x4c,in_R8D);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(n_strm.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    pvVar5 = (void *)std::ostream::operator<<(local_12a8,std::dec);
    pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(pvVar5,std::showpos);
    math::wide_integer::operator<<
              (pbVar9,(uintwide_t<256U,_unsigned_short,_void,_true> *)local_1130);
    std::__cxx11::stringstream::str();
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_4);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_12d8,pcVar10);
    std::__cxx11::string::~string((string *)&i_4);
    n_1.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_1130,
                    (uintwide_t<256U,_unsigned_short,_void,_true> *)local_12d8);
    local_1b52 = 0;
    if ((bool)n_1.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_) {
      local_1b52 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
    }
    u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1b52 & 1;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(n_strm.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  }
  n_1.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  n_1.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)n_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x400;
      n_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           n_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_1320,
               (test_uintwide_t_edge *)0x0,true,0x40,in_R8D);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(n_strm_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    pvVar5 = (void *)std::ostream::operator<<(local_1498,std::hex);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::showbase);
    pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(pvVar5,std::showpos);
    math::wide_integer::operator<<
              (pbVar9,(uintwide_t<256U,_unsigned_short,_void,_true> *)local_1320);
    std::__cxx11::stringstream::str();
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_5);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_14c8,pcVar10);
    std::__cxx11::string::~string((string *)&i_5);
    n_2.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_1320,
                    (uintwide_t<256U,_unsigned_short,_void,_true> *)local_14c8);
    local_1b72 = 0;
    if ((bool)n_2.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_) {
      local_1b72 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
    }
    u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1b72 & 1;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(n_strm_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  }
  n_2.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  n_2.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)n_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x400;
      n_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           n_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_1510,
               (test_uintwide_t_edge *)0x0,true,0x55,in_R8D);
    std::__cxx11::stringstream::stringstream
              ((stringstream *)(n_strm_2.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    pvVar5 = (void *)std::ostream::operator<<(local_1688,std::oct);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::showbase);
    pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
             std::ostream::operator<<(pvVar5,std::showpos);
    math::wide_integer::operator<<
              (pbVar9,(uintwide_t<256U,_unsigned_short,_void,_true> *)local_1510);
    std::__cxx11::stringstream::str();
    pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (m1.values.super_array<unsigned_short,_16UL>.elems + 0xd));
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_16b8,pcVar10);
    std::__cxx11::string::~string
              ((string *)(m1.values.super_array<unsigned_short,_16UL>.elems + 0xd));
    m1.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_1510,
                    (uintwide_t<256U,_unsigned_short,_void,_true> *)local_16b8);
    local_1b92 = 0;
    if ((bool)m1.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_) {
      local_1b92 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
    }
    u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1b92 & 1;
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)(n_strm_2.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  }
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_16fa,"-0x1");
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(m1_from_strm.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  pbVar9 = (basic_ostream<char,_std::char_traits<char>_> *)
           std::ostream::operator<<(local_1878,std::hex);
  math::wide_integer::operator<<(pbVar9,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_16fa)
  ;
  std::__cxx11::stringstream::str();
  pcVar10 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_18c8);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_18a8,pcVar10);
  std::__cxx11::string::~string((string *)local_18c8);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  local_18c9 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                         ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_18a8,&local_18ea);
  local_1ba2 = 0;
  if ((bool)local_18c9) {
    local_1ba2 = u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
  }
  u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_1ba2 & 1;
  std::__cxx11::stringstream::~stringstream
            ((stringstream *)(m1_from_strm.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  return (bool)(u.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ & 1);
}

Assistant:

auto test_various_ostream_ops() -> bool
{
  auto result_is_ok = true;

  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::dec << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '9';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '3';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(41719)));

    std::stringstream strm;

    strm << std::hex << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = 'X';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = 'A';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = 'F';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '7';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto u = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT32_C(29363)));

    std::stringstream strm;

    strm << std::oct << std::uppercase << std::showbase << std::setw(static_cast<std::streamsize>(INT8_C(100))) << std::setfill('#') << u;

    std::string str_ctrl(static_cast<std::size_t>(UINT8_C(100)), '#');

    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(5)))) = '0';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(4)))) = '7';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(3)))) = '1';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(2)))) = '2';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(1)))) = '6';
    str_ctrl.at(static_cast<std::size_t>(static_cast<std::size_t>(str_ctrl.size() - static_cast<std::size_t>(UINT8_C(1))) - static_cast<std::size_t>(UINT8_C(0)))) = '3';

    const auto result_u_fill_is_ok = (strm.str() == str_ctrl);

    result_is_ok = (result_u_fill_is_ok && result_is_ok);
  }

  {
    const auto z = local_uintwide_t_small_unsigned_type(static_cast<std::uint32_t>(UINT8_C(0)));

    {
      std::stringstream strm;

      strm << std::oct << z;

      const auto result_zero_print_as_oct_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_oct_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::dec << z;

      const auto result_zero_print_as_dec_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_dec_is_ok && result_is_ok);
    }

    {
      std::stringstream strm;

      strm << std::hex << z;

      const auto result_zero_print_as_hex_is_ok = (strm.str() == "0");

      result_is_ok = (result_zero_print_as_hex_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::hex,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto u =
      generate_wide_integer_value<local_uintwide_t_small_unsigned_type>
      (
        true,
        local_base::oct,
        std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << u;

    const local_uintwide_t_small_unsigned_type u_strm(strm.str().c_str());

    const auto result_u_is_ok = (u == u_strm);

    result_is_ok = (result_u_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::dec,
        std::numeric_limits<local_uintwide_t_small_signed_type>::digits10
      );

    std::stringstream strm;

    strm << std::dec << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::hex,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 4
      );

    std::stringstream strm;

    strm << std::hex << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT32_C(1024));
           ++i)
  {
    const auto n =
      generate_wide_integer_value<local_uintwide_t_small_signed_type>
      (
        false,
        local_base::oct,
        (std::numeric_limits<local_uintwide_t_small_signed_type>::digits + 1) / 3
      );

    std::stringstream strm;

    strm << std::oct << std::showbase << std::showpos << n;

    const local_uintwide_t_small_signed_type n_strm(strm.str().c_str());

    const auto result_n_is_ok = (n == n_strm);

    result_is_ok = (result_n_is_ok && result_is_ok);
  }

  {
    const local_uintwide_t_small_unsigned_type m1("-0x1");

    std::stringstream strm;

    strm << std::hex << m1;

    const local_uintwide_t_small_unsigned_type m1_from_strm(strm.str().c_str());

    const auto result_read_and_round_trip_neg_hex_str_is_ok =
    (
      m1_from_strm == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (result_read_and_round_trip_neg_hex_str_is_ok && result_is_ok);
  }

  return result_is_ok;
}